

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttable.cc
# Opt level: O1

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
upb::generator::FastDecodeTable_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,generator *this,MessageDefPtr message,DefPoolPair *pools)

{
  uint8_t uVar1;
  ushort uVar2;
  FieldDefPtr field;
  ulong __val;
  bool bVar3;
  undefined8 *puVar4;
  char cVar5;
  byte bVar19;
  uint uVar20;
  int iVar6;
  uint32_t uVar7;
  upb_CType uVar8;
  ulong uVar9;
  uint64_t uVar10;
  MessageDefPtr MVar11;
  upb_MiniTable *puVar12;
  upb_MiniTableField *puVar13;
  upb_OneofDef *puVar14;
  upb_MessageDef *m;
  upb_FileDef *puVar15;
  upb_FileDef *puVar16;
  ulong *puVar17;
  uint8_t uVar18;
  anon_union_8_7_dbb01f68_for_defaultval aVar21;
  char *pcVar22;
  long lVar23;
  pointer ppVar24;
  char cVar25;
  __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
  __i;
  size_type sVar26;
  long lVar27;
  undefined8 *puVar28;
  pointer ppVar29;
  ulong uVar30;
  initializer_list<unsigned_long> __l;
  string size_ceil;
  string __str;
  TableEntry ent;
  string cardinality;
  string type;
  vector<unsigned_long,_std::allocator<unsigned_long>_> breaks;
  char *local_178;
  undefined8 local_170;
  char local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  undefined4 uStack_164;
  undefined1 local_158 [32];
  unsigned_long local_138;
  char *local_130;
  undefined8 local_128;
  char *local_120;
  anon_union_8_7_dbb01f68_for_defaultval local_118;
  undefined8 *puStack_110;
  long local_108;
  uint64_t local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  ulong local_d0;
  undefined1 *local_c8;
  upb_FieldDef *local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  anon_union_8_2_9eb4e620_for_upb_Message_0 *local_a8;
  size_type local_a0;
  anon_union_8_2_9eb4e620_for_upb_Message_0 local_98 [2];
  upb_MessageDef *local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  ulong local_48;
  undefined8 *local_40;
  anon_union_8_7_dbb01f68_for_defaultval local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108 = 0;
  local_118.sint = 0;
  puStack_110 = (undefined8 *)0x0;
  local_88 = message.ptr_;
  iVar6 = upb_MessageDef_FieldCount((upb_MessageDef *)this);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::reserve
            ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)&local_118,(long)iVar6);
  if (iVar6 != 0) {
    sVar26 = 0;
    do {
      local_158._0_8_ = upb_MessageDef_Field((upb_MessageDef *)this,(int)sVar26);
      std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::
      emplace_back<upb::FieldDefPtr>
                ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)&local_118,
                 (FieldDefPtr *)local_158);
      sVar26 = sVar26 + 1;
    } while ((long)iVar6 != sVar26);
  }
  puVar4 = puStack_110;
  aVar21 = local_118;
  if ((undefined8 *)local_118.sint != puStack_110) {
    lVar27 = (long)puStack_110 - (long)local_118;
    uVar9 = lVar27 >> 3;
    lVar23 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
              (local_118.sint,puStack_110,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar27 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                (aVar21.sint,puVar4);
    }
    else {
      puVar28 = (undefined8 *)(aVar21.sint + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                (aVar21.sint,puVar28);
      for (; puVar28 != puVar4; puVar28 = puVar28 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Val_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                  (puVar28);
      }
    }
  }
  local_40 = puStack_110;
  if ((undefined8 *)local_118.sint == puStack_110) {
LAB_0010c124:
    if ((undefined8 *)local_118.sint != (undefined8 *)0x0) {
      operator_delete(local_118.msg,local_108 - (long)local_118);
    }
    return __return_storage_ptr__;
  }
  aVar21 = local_118;
LAB_0010b938:
  local_f0 = &local_e0;
  field.ptr_ = *aVar21.msg;
  local_e8 = 0;
  local_e0 = 0;
  local_d0 = 0;
  local_38 = aVar21;
  uVar10 = anon_unknown_0::GetEncodedTag(field);
  if (uVar10 < 0x8000) {
    MVar11.ptr_ = upb_FieldDef_ContainingType(field.ptr_);
    puVar12 = DefPoolPair::GetMiniTable64((DefPoolPair *)local_88,MVar11);
    uVar7 = upb_FieldDef_Number(field.ptr_);
    puVar13 = upb_MiniTable_FindFieldByNumber(puVar12,uVar7);
    local_a8 = local_98;
    local_a0 = 0;
    local_98[0].internal_opaque._0_1_ = 0;
    local_c8 = &local_b8;
    local_c0 = (upb_FieldDef *)0x0;
    local_b8 = 0;
    uVar1 = puVar13->descriptortype_dont_copy_me__upb_internal_use_only;
    uVar18 = uVar1;
    if (((puVar13->mode_dont_copy_me__upb_internal_use_only & 0x10) != 0) &&
       (uVar18 = '\x0e', uVar1 != '\x05')) {
      if (uVar1 != '\f') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
      uVar18 = '\t';
    }
    bVar3 = false;
    switch(uVar18) {
    case '\x01':
    case '\x06':
    case '\x10':
      pcVar22 = "f8";
      break;
    case '\x02':
    case '\a':
    case '\x0f':
      pcVar22 = "f4";
      break;
    case '\x03':
    case '\x04':
      pcVar22 = "v8";
      break;
    case '\x05':
    case '\r':
switchD_0010ba32_caseD_5:
      pcVar22 = "v4";
      break;
    case '\b':
      pcVar22 = "b1";
      break;
    case '\t':
      pcVar22 = "s";
      break;
    default:
      goto switchD_0010ba32_caseD_a;
    case '\v':
      pcVar22 = "m";
      break;
    case '\f':
      pcVar22 = "b";
      break;
    case '\x0e':
      if (uVar1 != '\x0e') goto switchD_0010ba32_caseD_5;
      goto LAB_0010bf5f;
    case '\x11':
      pcVar22 = "z4";
      break;
    case '\x12':
      pcVar22 = "z8";
    }
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)pcVar22);
    bVar19 = puVar13->mode_dont_copy_me__upb_internal_use_only & 3;
    if (bVar19 != 2) {
      if (bVar19 == 1) {
        pcVar22 = "p";
        if ((puVar13->mode_dont_copy_me__upb_internal_use_only & 4) == 0) {
          pcVar22 = "r";
        }
        goto LAB_0010bafd;
      }
      goto LAB_0010bf5f;
    }
    pcVar22 = "s";
    if (puVar13->presence < 0) {
      pcVar22 = "o";
    }
LAB_0010bafd:
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c0,(ulong)pcVar22);
    local_f8 = anon_unknown_0::GetEncodedTag(field);
    uVar20._0_2_ = puVar13->offset_dont_copy_me__upb_internal_use_only;
    uVar20._2_2_ = puVar13->presence;
    upb_FieldDef_IsRepeated(field.ptr_);
    puVar14 = upb_FieldDef_RealContainingOneof(field.ptr_);
    uVar9 = (ulong)uVar20 << 0x30 | local_f8;
    uVar2 = puVar13->presence;
    lVar23 = (long)(short)uVar2;
    if (puVar14 == (upb_OneofDef *)0x0) {
      if (uVar2 == 0) {
        lVar23 = 0x3f;
      }
      else if (0x1f < uVar2) goto LAB_0010bb8f;
      uVar30 = lVar23 << 0x18;
LAB_0010bb9f:
      uVar9 = uVar9 | uVar30;
      bVar3 = true;
    }
    else {
      if (((short)uVar2 < 0) && (uVar7 = upb_FieldDef_Number(field.ptr_), uVar7 < 0x100)) {
        uVar7 = upb_FieldDef_Number(field.ptr_);
        uVar30 = ((ulong)(uint)~(int)(short)uVar2 & 0xffff) << 0x20 | (ulong)(uVar7 << 0x18);
        goto LAB_0010bb9f;
      }
LAB_0010bb8f:
      bVar3 = false;
    }
    if (!bVar3) goto LAB_0010bf5f;
    uVar8 = upb_FieldDef_CType(field.ptr_);
    if (uVar8 == kUpb_CType_Message) {
      uVar2 = puVar13->submsg_index_dont_copy_me__upb_internal_use_only;
      uVar20 = (uint)uVar2;
      if ((ulong)uVar2 < 0x100) {
        local_178 = &local_168;
        uStack_166 = 0x78;
        local_168 = 'm';
        uStack_167 = 0x61;
        local_170 = 3;
        uStack_165 = 0;
        local_48 = (ulong)uVar2;
        m = upb_FieldDef_MessageSubDef(field.ptr_);
        puVar15 = upb_MessageDef_File(m);
        puVar16 = upb_FieldDef_File(field.ptr_);
        uVar30 = 0xffffffffffffffff;
        if (puVar15 == puVar16) {
          MVar11.ptr_ = upb_FieldDef_MessageSubDef(field.ptr_);
          puVar12 = DefPoolPair::GetMiniTable64((DefPoolPair *)local_88,MVar11);
          uVar30 = (ulong)puVar12->size_dont_copy_me__upb_internal_use_only + 8;
        }
        local_158._16_8_ = 0xc0;
        local_158._24_8_ = 0x100;
        local_158._0_8_ = (upb_FieldDef *)0x40;
        local_158._8_8_ = 0x80;
        __l._M_len = 4;
        __l._M_array = (iterator)local_158;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_80,__l,(allocator_type *)&local_68);
        for (puVar17 = local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            puVar17 !=
            local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; puVar17 = puVar17 + 1) {
          __val = *puVar17;
          if (uVar30 <= __val) {
            cVar25 = '\x01';
            if (__val < 10) goto LAB_0010bdd1;
            uVar30 = __val;
            cVar5 = '\x04';
            goto LAB_0010bd94;
          }
        }
        goto LAB_0010be1f;
      }
      goto LAB_0010bf4a;
    }
    local_130 = "1";
    if (0xff < local_f8) {
      local_130 = "2";
    }
    local_170 = 0;
    local_168 = '\0';
    local_158._0_8_ = local_c0;
    local_158._8_8_ = local_c8;
    local_158._16_8_ = local_a0;
    local_158._24_8_ = local_a8;
    local_138 = 1;
    local_178 = &local_168;
    absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
              ((string *)&local_178,0xe,"upb_p$0$1_$2bt",local_158,3);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_178);
    if (local_178 != &local_168) {
      operator_delete(local_178,
                      CONCAT44(uStack_164,
                               CONCAT13(uStack_165,
                                        CONCAT12(uStack_166,CONCAT11(uStack_167,local_168)))) + 1);
    }
    goto LAB_0010bf52;
  }
  goto LAB_0010c0ed;
  while( true ) {
    if (uVar30 < 10000) goto LAB_0010bdd1;
    bVar3 = uVar30 < 100000;
    uVar30 = uVar30 / 10000;
    cVar5 = cVar25 + '\x04';
    if (bVar3) break;
LAB_0010bd94:
    cVar25 = cVar5;
    if (uVar30 < 100) {
      cVar25 = cVar25 + -2;
      goto LAB_0010bdd1;
    }
    if (uVar30 < 1000) {
      cVar25 = cVar25 + -1;
      goto LAB_0010bdd1;
    }
  }
  cVar25 = cVar25 + '\x01';
LAB_0010bdd1:
  local_158._0_8_ = (upb_FieldDef *)(local_158 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_158,cVar25);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_158._0_8_,local_158._8_4_,__val);
  std::__cxx11::string::operator=((string *)&local_178,(string *)local_158);
  if ((upb_FieldDef *)local_158._0_8_ != (upb_FieldDef *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
LAB_0010be1f:
  local_130 = "1";
  if (0xff < local_f8) {
    local_130 = "2";
  }
  local_60 = 0;
  local_58 = 0;
  local_158._0_8_ = local_c0;
  local_158._8_8_ = local_c8;
  local_158._16_8_ = local_a0;
  local_158._24_8_ = local_a8;
  local_138 = 1;
  local_128 = local_170;
  local_120 = local_178;
  local_68 = &local_58;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            ((allocator_type *)&local_68,0x15,"upb_p$0$1_$2bt_max$3b",local_158,4);
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,
                    CONCAT44(uStack_164,
                             CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(uStack_167,local_168))
                                     )) + 1);
  }
  uVar20 = (uint)local_48;
  uVar9 = uVar9 | uVar20 << 0x10;
LAB_0010bf4a:
  if (uVar20 < 0x100) {
LAB_0010bf52:
    bVar3 = true;
    local_d0 = uVar9;
  }
  else {
LAB_0010bf5f:
    bVar3 = false;
  }
switchD_0010ba32_caseD_a:
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,CONCAT71(local_98[0].internal_opaque._1_7_,
                                      (undefined1)local_98[0].internal_opaque) + 1);
  }
  if (bVar3) {
    uVar9 = (ulong)((uint)(uVar10 >> 3) & 0x1f);
    if (0x7fff < uVar10) {
      uVar9 = 0xffffffff;
    }
    ppVar29 = (__return_storage_ptr__->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar24 = (__return_storage_ptr__->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar30 = ((long)ppVar24 - (long)ppVar29 >> 3) * -0x3333333333333333;
    if (uVar30 < uVar9 || uVar30 - uVar9 == 0) {
      do {
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,"_upb_FastDecoder_DecodeGeneric","");
        sVar26 = uVar30 * 2;
        if (ppVar24 == ppVar29) {
          sVar26 = 1;
        }
        local_138 = 0;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::resize(__return_storage_ptr__,sVar26,(value_type *)local_158);
        if ((upb_FieldDef *)local_158._0_8_ != (upb_FieldDef *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        ppVar29 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar24 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        uVar30 = ((long)ppVar24 - (long)ppVar29 >> 3) * -0x3333333333333333;
      } while (uVar30 < uVar9 || uVar30 - uVar9 == 0);
    }
    iVar6 = std::__cxx11::string::compare((char *)(ppVar29 + uVar9));
    if (iVar6 == 0) {
      ppVar29 = (__return_storage_ptr__->
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar9;
      std::__cxx11::string::_M_assign((string *)ppVar29);
      ppVar29->second = local_d0;
    }
  }
LAB_0010c0ed:
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  aVar21.str = (str_t *)(local_38.str)->str;
  if ((undefined8 *)aVar21.sint == local_40) goto LAB_0010c124;
  goto LAB_0010b938;
}

Assistant:

std::vector<TableEntry> FastDecodeTable(upb::MessageDefPtr message,
                                        const DefPoolPair& pools) {
  std::vector<TableEntry> table;
  for (const auto field : FieldHotnessOrder(message)) {
    TableEntry ent;
    int slot = GetTableSlot(field);
    // std::cerr << "table slot: " << field->number() << ": " << slot << "\n";
    if (slot < 0) {
      // Tag can't fit in the table.
      continue;
    }
    if (!TryFillTableEntry(pools, field, ent)) {
      // Unsupported field type or offset, hasbit index, etc. doesn't fit.
      continue;
    }
    while ((size_t)slot >= table.size()) {
      size_t size = std::max(static_cast<size_t>(1), table.size() * 2);
      table.resize(size, TableEntry{"_upb_FastDecoder_DecodeGeneric", 0});
    }
    if (table[slot].first != "_upb_FastDecoder_DecodeGeneric") {
      // A hotter field already filled this slot.
      continue;
    }
    table[slot] = ent;
  }
  return table;
}